

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosMath.cpp
# Opt level: O1

size_t adios2::helper::NextExponentialSize
                 (size_t requiredSize,size_t currentSize,float growthFactor)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double dVar5;
  
  if (currentSize != 0) {
    if (requiredSize <= currentSize) {
      return currentSize;
    }
    auVar3._8_4_ = (int)(requiredSize >> 0x20);
    auVar3._0_8_ = requiredSize;
    auVar3._12_4_ = 0x45300000;
    auVar4._8_4_ = (int)(currentSize >> 0x20);
    auVar4._0_8_ = currentSize;
    auVar4._12_4_ = 0x45300000;
    dVar5 = (auVar4._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)currentSize) - 4503599627370496.0);
    dVar1 = log(((auVar3._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)requiredSize) - 4503599627370496.0)) / dVar5);
    dVar2 = log((double)growthFactor);
    dVar1 = ceil(dVar1 / dVar2);
    dVar1 = pow((double)growthFactor,dVar1);
    dVar1 = ceil(dVar1 * dVar5);
    requiredSize = (long)(dVar1 - 9.223372036854776e+18) & (long)dVar1 >> 0x3f | (long)dVar1;
  }
  return requiredSize;
}

Assistant:

size_t NextExponentialSize(const size_t requiredSize, const size_t currentSize,
                           const float growthFactor) noexcept
{
    if (currentSize == 0)
    {
        return requiredSize;
    }
    if (currentSize >= requiredSize)
    {
        return currentSize;
    }

    const double growthFactorDouble = static_cast<double>(growthFactor);

    const double numerator =
        std::log(static_cast<double>(requiredSize) / static_cast<double>(currentSize));
    const double denominator = std::log(growthFactorDouble);
    const double n = std::ceil(numerator / denominator);

    const size_t nextExponentialSize =
        static_cast<size_t>(std::ceil(std::pow(growthFactorDouble, n) * currentSize));

    return nextExponentialSize;
}